

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# task_notifier.cpp
# Opt level: O1

void __thiscall
duckdb::TaskNotifier::TaskNotifier
          (TaskNotifier *this,optional_ptr<duckdb::ClientContext,_true> context_p)

{
  pointer this_00;
  ClientContextState *pCVar1;
  shared_ptr<duckdb::ClientContextState,_true> *state;
  pointer this_01;
  vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
  local_38;
  
  (this->context).ptr = context_p.ptr;
  if (context_p.ptr != (ClientContext *)0x0) {
    optional_ptr<duckdb::ClientContext,_true>::CheckValid(&this->context);
    this_00 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
              ::operator->(&((this->context).ptr)->registered_state);
    RegisteredStateManager::States
              ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)&local_38,
               this_00);
    for (this_01 = local_38.
                   super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        this_01 !=
        local_38.
        super__Vector_base<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; this_01 = this_01 + 1) {
      pCVar1 = shared_ptr<duckdb::ClientContextState,_true>::operator->(this_01);
      optional_ptr<duckdb::ClientContext,_true>::CheckValid(&this->context);
      (**(code **)(*(long *)pCVar1 + 0x80))(pCVar1,(this->context).ptr);
    }
    ::std::
    vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
    ::~vector(&local_38);
  }
  return;
}

Assistant:

TaskNotifier::TaskNotifier(optional_ptr<ClientContext> context_p) : context(context_p) {
	if (context) {
		for (auto &state : context->registered_state->States()) {
			state->OnTaskStart(*context);
		}
	}
}